

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O3

void Security::InsertRandomFunctionPad(Instr *instrBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  UINT_PTR UVar3;
  Instr *instr;
  undefined4 *puVar4;
  uint uVar5;
  
  this = JITTimeWorkItem::GetJITFunctionBody(instrBeforeInstr->m_func->topFunc->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(instrBeforeInstr->m_func->topFunc->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InsertNOPsPhase,sourceContextId,functionId);
  if (((!bVar2) &&
      (bVar2 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag), !bVar2)) {
    UVar3 = Math::Rand();
    uVar5 = (uint)UVar3 & 0xf;
    if (uVar5 == 1) {
      instr = IR::Instr::New(NOP,instrBeforeInstr->m_func);
      IR::Instr::InsertBefore(instrBeforeInstr,instr);
      return;
    }
    if ((UVar3 & 1) != 0) {
      InsertSmallNOP(instrBeforeInstr,3);
      uVar5 = uVar5 - 3;
    }
    if ((uVar5 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x94,"((randomPad & 1) == 0)","(randomPad & 1) == 0");
      if (!bVar2) goto LAB_00623b23;
      *puVar4 = 0;
    }
    for (; 3 < uVar5; uVar5 = uVar5 - 4) {
      InsertSmallNOP(instrBeforeInstr,4);
    }
    if (uVar5 != 0) {
      if (uVar5 != 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                           ,0x9a,"(randomPad == 2 || randomPad == 0)",
                           "randomPad == 2 || randomPad == 0");
        if (!bVar2) {
LAB_00623b23:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        if (uVar5 != 2) {
          return;
        }
      }
      InsertSmallNOP(instrBeforeInstr,2);
      return;
    }
  }
  return;
}

Assistant:

void
Security::InsertRandomFunctionPad(IR::Instr * instrBeforeInstr)
{
    if (PHASE_OFF(Js::InsertNOPsPhase, instrBeforeInstr->m_func->GetTopFunc())
        || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }
    DWORD randomPad = Math::Rand() & ((0 - INSTR_ALIGNMENT) & 0xF);
#ifndef _M_ARM
    if (randomPad == 1)
    {
        InsertSmallNOP(instrBeforeInstr, 1);
        return;
    }
    if (randomPad & 1)
    {
        InsertSmallNOP(instrBeforeInstr, 3);
        randomPad -= 3;
    }
#endif
    Assert((randomPad & 1) == 0);
    while (randomPad >= 4)
    {
        InsertSmallNOP(instrBeforeInstr, 4);
        randomPad -= 4;
    }
    Assert(randomPad == 2 || randomPad == 0);
    if (randomPad == 2)
    {
        InsertSmallNOP(instrBeforeInstr, 2);
    }
}